

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cc
# Opt level: O2

string * __thiscall
upb::generator::MiniTableMessageVarName_abi_cxx11_
          (string *__return_storage_ptr__,generator *this,string_view full_name)

{
  string local_30;
  
  (anonymous_namespace)::MangleName_abi_cxx11_(&local_30,(_anonymous_namespace_ *)this,full_name);
  std::operator+(__return_storage_ptr__,&local_30,"_msg_init");
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string MiniTableMessageVarName(absl::string_view full_name) {
  return MangleName(full_name) + "_msg_init";
}